

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O0

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits,bool val)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  int new_size_words;
  int old_size_words;
  int b;
  int s;
  bool val_local;
  int bits_local;
  bitfield *this_local;
  
  iVar1 = size(this);
  if (bits != iVar1) {
    iVar1 = size(this);
    uVar2 = size(this);
    resize(this,bits);
    iVar3 = size(this);
    if (iVar1 < iVar3) {
      iVar1 = (iVar1 + 0x1f) / 0x20;
      iVar3 = num_words(this);
      if (val) {
        if ((iVar1 != 0) && ((uVar2 & 0x1f) != 0)) {
          uVar4 = libtorrent::aux::host_to_network(0xffffffff >> (sbyte)(uVar2 & 0x1f));
          puVar5 = buf(this);
          puVar5[iVar1 + -1] = uVar4 | puVar5[iVar1 + -1];
        }
        if (iVar1 < iVar3) {
          puVar5 = buf(this);
          memset(puVar5 + iVar1,0xff,(long)(iVar3 - iVar1) << 2);
        }
        clear_trailing_bits(this);
      }
      else if (iVar1 < iVar3) {
        puVar5 = buf(this);
        memset(puVar5 + iVar1,0,(long)(iVar3 - iVar1) << 2);
      }
    }
  }
  return;
}

Assistant:

void bitfield::resize(int const bits, bool const val)
	{
		if (bits == size()) return;

		int const s = size();
		int const b = size() & 31;
		resize(bits);
		if (s >= size()) return;
		int const old_size_words = (s + 31) / 32;
		int const new_size_words = num_words();
		if (val)
		{
			if (old_size_words && b) buf()[old_size_words - 1] |= aux::host_to_network(0xffffffff >> b);
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0xff
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
			clear_trailing_bits();
		}
		else
		{
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0x00
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
		}
		TORRENT_ASSERT(size() == bits);
	}